

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

void __thiscall ChunkedStackPool<4092>::~ChunkedStackPool(ChunkedStackPool<4092> *this)

{
  ChunkedStackPool<4092> *this_local;
  
  Reset(this);
  return;
}

Assistant:

~ChunkedStackPool()
	{
		Reset();
	}